

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  PromiseNode *pPVar1;
  Fault FVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  TransformPromiseNodeBase *pTVar5;
  Disposer *in_RCX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *pAVar6;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX;
  _func_int **pp_Var7;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_00;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_01;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_02;
  Disposer *pDVar8;
  Disposer *pDVar9;
  Exception *pEVar10;
  PromiseNode *pPVar11;
  PromiseNode *pPVar12;
  undefined1 *puVar13;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_>_> OVar14;
  Own<kj::_::ChainPromiseNode> OVar15;
  Promise<unsigned_long> PVar16;
  Fault f_1;
  Fault f;
  Promise<void> promise;
  Own<kj::_::PromiseNode> local_c8;
  Fault local_b8;
  undefined8 uStack_b0;
  Own<kj::_::PromiseNode> local_a8;
  TransformPromiseNodeBase *local_98;
  BlockedWrite *local_90;
  Promise<unsigned_long> local_88;
  Promise<unsigned_long> local_78;
  Promise<unsigned_long> local_68;
  Disposer *local_58;
  PromiseNode *local_50;
  AsyncOutputStream *local_48;
  _func_int **local_40;
  PromiseNode *local_38;
  
  local_90 = this;
  if (output[8]._vptr_AsyncOutputStream != (_func_int **)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x180,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&local_b8);
  }
  pDVar8 = (Disposer *)output[5]._vptr_AsyncOutputStream;
  if (in_RCX < pDVar8) {
    (*(code *)**(undefined8 **)amount)(&local_c8,amount,output[4]._vptr_AsyncOutputStream);
    pTVar5 = (TransformPromiseNodeBase *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,&local_c8,
               _::
               TransformPromiseNode<unsigned_long,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:389:19),_kj::_::PropagateException>
               ::anon_class_16_2_34952053_for_func::operator());
    (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00467d08;
    pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    pTVar5[1].dependency.disposer = in_RCX;
    local_68.super_PromiseBase.node.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_68.super_PromiseBase.node.ptr = (PromiseNode *)pTVar5;
    OVar14 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                       ((kj *)&local_b8,(Canceler *)(output + 8),&local_68);
    pPVar1 = local_68.super_PromiseBase.node.ptr;
    pAVar6 = OVar14.ptr;
    uVar3 = (undefined4)uStack_b0;
    uVar4 = uStack_b0._4_4_;
    uStack_b0 = (TransformPromiseNodeBase *)0x0;
    *(undefined4 *)&(local_90->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_b8.exception._0_4_;
    *(undefined4 *)
     ((long)&(local_90->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_b8.exception._4_4_;
    *(undefined4 *)&(local_90->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream
         = uVar3;
    *(undefined4 *)
     ((long)&(local_90->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uVar4;
    if ((TransformPromiseNodeBase *)local_68.super_PromiseBase.node.ptr !=
        (TransformPromiseNodeBase *)0x0) {
      local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_68.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_68.super_PromiseBase.node.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pAVar6 = extraout_RDX;
    }
    pTVar5 = (TransformPromiseNodeBase *)local_c8.ptr;
    if ((TransformPromiseNodeBase *)local_c8.ptr == (TransformPromiseNodeBase *)0x0)
    goto LAB_00321c76;
    local_c8.ptr = (PromiseNode *)0x0;
    pEVar10 = (Exception *)local_c8.disposer;
  }
  else {
    pPVar1 = (PromiseNode *)output[7]._vptr_AsyncOutputStream;
    if (pPVar1 == (PromiseNode *)0x0) {
      pPVar12 = (PromiseNode *)0x0;
    }
    else {
      pp_Var7 = output[6]._vptr_AsyncOutputStream + 1;
      pPVar11 = (PromiseNode *)0x0;
      do {
        pDVar9 = (Disposer *)(*pp_Var7 + (long)pDVar8);
        pPVar12 = pPVar11;
        if (in_RCX < pDVar9) break;
        pPVar11 = (PromiseNode *)((long)&pPVar11->_vptr_PromiseNode + 1);
        pp_Var7 = pp_Var7 + 2;
        pDVar8 = pDVar9;
        pPVar12 = pPVar1;
      } while (pPVar1 != pPVar11);
    }
    local_48 = output + 8;
    (*(code *)**(undefined8 **)amount)(&local_a8,amount,output[4]._vptr_AsyncOutputStream);
    pTVar5 = (TransformPromiseNodeBase *)local_a8.ptr;
    if (pPVar12 != (PromiseNode *)0x0) {
      local_98 = (TransformPromiseNodeBase *)output[6]._vptr_AsyncOutputStream;
      pTVar5 = (TransformPromiseNodeBase *)operator_new(0x40);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar5,&local_a8,
                 _::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:410:32),_kj::_::PropagateException>
                 ::anon_class_24_2_d8a1eacd_for_func::operator());
      (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00467d90;
      pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)amount;
      pTVar5[1].dependency.disposer = (Disposer *)local_98;
      pTVar5[1].dependency.ptr = pPVar12;
      local_c8.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#2},kj::_::PropagateException>>
            ::instance;
      local_c8.ptr = (PromiseNode *)pTVar5;
      OVar15 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_b8,&local_c8);
      FVar2.exception = local_b8.exception;
      pPVar1 = local_c8.ptr;
      pTVar5 = uStack_b0;
      if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
        local_c8.ptr = (PromiseNode *)0x0;
        local_98 = uStack_b0;
        (**(_func_int **)(((String *)&(local_c8.disposer)->_vptr_Disposer)->content).ptr)
                  (local_c8.disposer,
                   ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar15.ptr)
        ;
        pTVar5 = local_98;
      }
      pDVar9 = local_a8.disposer;
      local_a8.disposer = (Disposer *)FVar2.exception;
      if ((TransformPromiseNodeBase *)local_a8.ptr != (TransformPromiseNodeBase *)0x0) {
        pPVar1 = (PromiseNode *)&(local_a8.ptr)->_vptr_PromiseNode;
        pPVar11 = (PromiseNode *)&(local_a8.ptr)->_vptr_PromiseNode;
        local_a8.ptr = &pTVar5->super_PromiseNode;
        (**(_func_int **)(((String *)&pDVar9->_vptr_Disposer)->content).ptr)
                  (pDVar9,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar11->_vptr_PromiseNode);
        pTVar5 = (TransformPromiseNodeBase *)local_a8.ptr;
      }
    }
    local_a8.ptr = &pTVar5->super_PromiseNode;
    local_98 = (TransformPromiseNodeBase *)output[7]._vptr_AsyncOutputStream;
    if ((TransformPromiseNodeBase *)pPVar12 == local_98) {
      pTVar5 = (TransformPromiseNodeBase *)operator_new(0x48);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar5,&local_a8,
                 _::
                 TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:415:43),_kj::_::PropagateException>
                 ::anon_class_32_4_246a692a_for_func::operator());
      (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00467e18;
      pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
      pTVar5[1].dependency.disposer = (Disposer *)amount;
      pTVar5[1].dependency.ptr = (PromiseNode *)in_RCX;
      pTVar5[1].continuationTracePtr = pDVar8;
      local_c8.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#3},kj::_::PropagateException>>
            ::instance;
      local_c8.ptr = (PromiseNode *)pTVar5;
      OVar15 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_b8,&local_c8);
      pPVar1 = local_c8.ptr;
      local_88.super_PromiseBase.node.disposer._0_4_ = local_b8.exception._0_4_;
      local_88.super_PromiseBase.node.disposer._4_4_ = local_b8.exception._4_4_;
      local_88.super_PromiseBase.node.ptr = &uStack_b0->super_PromiseNode;
      if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
        local_c8.ptr = (PromiseNode *)0x0;
        (**(_func_int **)(((String *)&(local_c8.disposer)->_vptr_Disposer)->content).ptr)
                  (local_c8.disposer,
                   ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar15.ptr)
        ;
      }
      OVar14 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                         ((kj *)&local_b8,(Canceler *)local_48,&local_88);
      pPVar1 = local_88.super_PromiseBase.node.ptr;
      pAVar6 = OVar14.ptr;
      uVar3 = (undefined4)uStack_b0;
      uVar4 = uStack_b0._4_4_;
      uStack_b0 = (TransformPromiseNodeBase *)0x0;
      *(undefined4 *)&(local_90->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
           = local_b8.exception._0_4_;
      *(undefined4 *)
       ((long)&(local_90->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
           local_b8.exception._4_4_;
      *(undefined4 *)
       &(local_90->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = uVar3;
      *(undefined4 *)
       ((long)&(local_90->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4)
           = uVar4;
      if ((TransformPromiseNodeBase *)local_88.super_PromiseBase.node.ptr !=
          (TransformPromiseNodeBase *)0x0) {
        local_88.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT44(local_88.super_PromiseBase.node.disposer._4_4_,
                             local_88.super_PromiseBase.node.disposer._0_4_))
                  ((undefined8 *)
                   CONCAT44(local_88.super_PromiseBase.node.disposer._4_4_,
                            local_88.super_PromiseBase.node.disposer._0_4_),
                   ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
        pAVar6 = extraout_RDX_00;
      }
    }
    else {
      local_50 = (PromiseNode *)((long)in_RCX - (long)pDVar8);
      local_40 = output[6]._vptr_AsyncOutputStream;
      local_38 = (PromiseNode *)((long)local_40[(long)pPVar12 * 2 + 1] - (long)local_50);
      if ((PromiseNode *)local_40[(long)pPVar12 * 2 + 1] < local_50) {
        local_c8.disposer = (Disposer *)0x0;
        local_b8.exception = (Exception *)0x0;
        uStack_b0 = (TransformPromiseNodeBase *)0x0;
        _::Debug::Fault::init
                  ((Fault *)&local_c8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                  );
        _::Debug::Fault::fatal((Fault *)&local_c8);
      }
      local_58 = (Disposer *)local_40[(long)pPVar12 * 2];
      if (in_RCX != pDVar8) {
        pTVar5 = (TransformPromiseNodeBase *)operator_new(0x40);
        _::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar5,&local_a8,
                   _::
                   TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:437:34),_kj::_::PropagateException>
                   ::anon_class_24_2_e72e484a_for_func::operator());
        (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00467f28;
        pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)amount;
        pTVar5[1].dependency.disposer = local_58;
        pTVar5[1].dependency.ptr = local_50;
        local_c8.disposer =
             (Disposer *)
             &_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#4},kj::_::PropagateException>>
              ::instance;
        local_c8.ptr = (PromiseNode *)pTVar5;
        OVar15 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                           ((kj *)&local_b8,&local_c8);
        pTVar5 = uStack_b0;
        FVar2.exception = local_b8.exception;
        pPVar1 = local_c8.ptr;
        if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
          local_c8.ptr = (PromiseNode *)0x0;
          (**(_func_int **)(((String *)&(local_c8.disposer)->_vptr_Disposer)->content).ptr)
                    (local_c8.disposer,
                     ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                     (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,
                     OVar15.ptr);
        }
        pPVar1 = local_a8.ptr;
        pDVar8 = local_a8.disposer;
        local_a8.disposer = (Disposer *)FVar2.exception;
        local_a8.ptr = &pTVar5->super_PromiseNode;
        if ((TransformPromiseNodeBase *)pPVar1 != (TransformPromiseNodeBase *)0x0) {
          (**(_func_int **)(((String *)&pDVar8->_vptr_Disposer)->content).ptr)
                    (pDVar8,((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                            (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
        }
      }
      pTVar5 = (TransformPromiseNodeBase *)operator_new(0x58);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar5,&local_a8,
                 _::
                 TransformPromiseNode<unsigned_long,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:442:43),_kj::_::PropagateException>
                 ::anon_class_48_4_354179c9_for_func::operator());
      puVar13 = (undefined1 *)((long)&pPVar12->_vptr_PromiseNode + 1);
      (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00467fb0;
      pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
      pTVar5[1].dependency.disposer =
           (Disposer *)((long)&local_50->_vptr_PromiseNode + (long)&local_58->_vptr_Disposer);
      pTVar5[1].dependency.ptr = local_38;
      pTVar5[1].continuationTracePtr = local_40 + (long)puVar13 * 2;
      pTVar5[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)((long)local_98 - (long)puVar13)
      ;
      pTVar5[2].dependency.disposer = in_RCX;
      local_78.super_PromiseBase.node.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#5},kj::_::PropagateException>>
            ::instance;
      local_78.super_PromiseBase.node.ptr = (PromiseNode *)pTVar5;
      OVar14 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                         ((kj *)&local_b8,(Canceler *)local_48,&local_78);
      pPVar1 = local_78.super_PromiseBase.node.ptr;
      pAVar6 = OVar14.ptr;
      uVar3 = (undefined4)uStack_b0;
      uVar4 = uStack_b0._4_4_;
      uStack_b0 = (TransformPromiseNodeBase *)0x0;
      *(undefined4 *)&(local_90->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
           = local_b8.exception._0_4_;
      *(undefined4 *)
       ((long)&(local_90->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
           local_b8.exception._4_4_;
      *(undefined4 *)
       &(local_90->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = uVar3;
      *(undefined4 *)
       ((long)&(local_90->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4)
           = uVar4;
      if ((TransformPromiseNodeBase *)local_78.super_PromiseBase.node.ptr !=
          (TransformPromiseNodeBase *)0x0) {
        local_78.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (**(local_78.super_PromiseBase.node.disposer)->_vptr_Disposer)
                  (local_78.super_PromiseBase.node.disposer,
                   ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
        pAVar6 = extraout_RDX_01;
      }
    }
    pTVar5 = (TransformPromiseNodeBase *)local_a8.ptr;
    if ((TransformPromiseNodeBase *)local_a8.ptr == (TransformPromiseNodeBase *)0x0)
    goto LAB_00321c76;
    local_a8.ptr = (PromiseNode *)0x0;
    pEVar10 = (Exception *)local_a8.disposer;
  }
  (**(_func_int **)(pEVar10->ownFile).content.ptr)
            (pEVar10,(pTVar5->super_PromiseNode)._vptr_PromiseNode[-2] +
                     (long)&(pTVar5->super_PromiseNode)._vptr_PromiseNode);
  pAVar6 = extraout_RDX_02;
LAB_00321c76:
  PVar16.super_PromiseBase.node.ptr = (PromiseNode *)pAVar6;
  PVar16.super_PromiseBase.node.disposer = (Disposer *)local_90;
  return (Promise<unsigned_long>)PVar16.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      if (amount < writeBuffer.size()) {
        // Consume a portion of the write buffer.
        return canceler.wrap(output.write(writeBuffer.begin(), amount)
            .then([this,amount]() {
          writeBuffer = writeBuffer.slice(amount, writeBuffer.size());
          // We pumped the full amount, so we're done pumping.
          return amount;
        }));
      }

      // First piece doesn't cover the whole pump. Figure out how many more pieces to add.
      uint64_t actual = writeBuffer.size();
      size_t i = 0;
      while (i < morePieces.size() &&
             amount >= actual + morePieces[i].size()) {
        actual += morePieces[i++].size();
      }

      // Write the first piece.
      auto promise = output.write(writeBuffer.begin(), writeBuffer.size());

      // Write full pieces as a single gather-write.
      if (i > 0) {
        auto more = morePieces.slice(0, i);
        promise = promise.then([&output,more]() { return output.write(more); });
      }

      if (i == morePieces.size()) {
        // This will complete the write.
        return canceler.wrap(promise.then([this,&output,amount,actual]() -> Promise<uint64_t> {
          canceler.release();
          fulfiller.fulfill();
          pipe.endState(*this);

          if (actual == amount) {
            // Oh, we had exactly enough.
            return actual;
          } else {
            return pipe.pumpTo(output, amount - actual)
                .then([actual](uint64_t actual2) { return actual + actual2; });
          }
        }));
      } else {
        // Pump ends mid-piece. Write the last, partial piece.
        auto n = amount - actual;
        auto splitPiece = morePieces[i];
        KJ_ASSERT(n <= splitPiece.size());
        auto newWriteBuffer = splitPiece.slice(n, splitPiece.size());
        auto newMorePieces = morePieces.slice(i + 1, morePieces.size());
        auto prefix = splitPiece.slice(0, n);
        if (prefix.size() > 0) {
          promise = promise.then([&output,prefix]() {
            return output.write(prefix.begin(), prefix.size());
          });
        }

        return canceler.wrap(promise.then([this,newWriteBuffer,newMorePieces,amount]() {
          writeBuffer = newWriteBuffer;
          morePieces = newMorePieces;
          canceler.release();
          return amount;
        }));
      }
    }